

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildLdSpreadIndices(IRBuilder *this,uint32 offset,uint32 spreadAuxOffset)

{
  Instr *this_00;
  ArgSlot AVar1;
  Type *ppIVar2;
  Opnd *this_01;
  SymOpnd *pSVar3;
  StackSym *pSVar4;
  Instr *pIStack_28;
  RegSlot lastArg;
  Instr *instr;
  Opnd *auxArg;
  uint32 spreadAuxOffset_local;
  uint32 offset_local;
  IRBuilder *this_local;
  
  auxArg._0_4_ = spreadAuxOffset;
  auxArg._4_4_ = offset;
  _spreadAuxOffset_local = this;
  instr = (Instr *)BuildAuxArrayOpnd(this,AuxIntArray,spreadAuxOffset);
  pIStack_28 = IR::Instr::New(LdSpreadIndices,this->m_func);
  IR::Instr::SetSrc1(pIStack_28,(Opnd *)instr);
  ppIVar2 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->m_argStack->
                        super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  this_01 = IR::Instr::GetDst(*ppIVar2);
  pSVar3 = IR::Opnd::AsSymOpnd(this_01);
  pSVar4 = IR::Opnd::GetStackSym(&pSVar3->super_Opnd);
  AVar1 = StackSym::GetArgSlotNum(pSVar4);
  this_00 = pIStack_28;
  pSVar4 = SymTable::GetArgSlotSym(this->m_func->m_symTable,AVar1 + 1);
  pSVar3 = IR::SymOpnd::New(&pSVar4->super_Sym,TyVar,this->m_func);
  IR::Instr::SetDst(this_00,&pSVar3->super_Opnd);
  AddInstr(this,pIStack_28,0xffffffff);
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Push
            (this->m_argStack,&stack0xffffffffffffffd8);
  return;
}

Assistant:

void IRBuilder::BuildLdSpreadIndices(uint32 offset, uint32 spreadAuxOffset)
{
    // Link up the LdSpreadIndices instr to be the first in the arg chain. This will allow us to find it in Lowerer easier.
    IR::Opnd *auxArg = this->BuildAuxArrayOpnd(AuxArrayValue::AuxIntArray, spreadAuxOffset);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::LdSpreadIndices, m_func);
    instr->SetSrc1(auxArg);

    // Create the link to the first arg.
    Js::RegSlot lastArg = m_argStack->Head()->GetDst()->AsSymOpnd()->GetStackSym()->GetArgSlotNum();
    instr->SetDst(IR::SymOpnd::New(m_func->m_symTable->GetArgSlotSym((uint16) (lastArg + 1)), TyVar, m_func));
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    m_argStack->Push(instr);
}